

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O1

shared_ptr<minja::Expression> __thiscall minja::Parser::parseArray(Parser *this)

{
  element_type *peVar1;
  char *pcVar2;
  char *pcVar3;
  undefined8 uVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  runtime_error *prVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  Parser *in_RSI;
  char *__end;
  shared_ptr<minja::Expression> sVar9;
  shared_ptr<minja::Expression> expr;
  vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
  elements;
  shared_ptr<minja::Expression> first_expr;
  string local_a8;
  undefined1 local_88 [32];
  vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
  local_68;
  shared_ptr<minja::Expression> local_48;
  CharIterator local_38;
  
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"[","");
  consumeToken((string *)local_88,in_RSI,&local_a8,Strip);
  uVar4 = local_88._8_8_;
  _Var8._M_pi = extraout_RDX;
  if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
    _Var8._M_pi = extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    _Var8._M_pi = extraout_RDX_01;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4 ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (this->template_str).
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    (this->template_str).
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    local_68.
    super__Vector_base<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.
    super__Vector_base<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.
    super__Vector_base<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"]","");
    consumeToken((string *)local_88,in_RSI,&local_a8,Strip);
    uVar4 = local_88._8_8_;
    if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
      operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4 ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      parseExpression((Parser *)&local_48,SUB81(in_RSI,0));
      if ((element_type *)
          local_48.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,"Expected first expression in array");
      }
      else {
        local_38._M_current = (char *)this;
        std::
        vector<std::shared_ptr<minja::Expression>,std::allocator<std::shared_ptr<minja::Expression>>>
        ::emplace_back<std::shared_ptr<minja::Expression>>
                  ((vector<std::shared_ptr<minja::Expression>,std::allocator<std::shared_ptr<minja::Expression>>>
                    *)&local_68,&local_48);
        if ((in_RSI->it)._M_current != (in_RSI->end)._M_current) {
          do {
            local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,",","");
            consumeToken((string *)local_88,in_RSI,&local_a8,Strip);
            uVar4 = local_88._8_8_;
            if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
              operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
              operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4 ==
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"]","");
              consumeToken((string *)local_88,in_RSI,&local_a8,Strip);
              if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
                operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1
                               );
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ ==
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error
                          (prVar5,"Expected comma or closing bracket in array");
                goto LAB_0020beed;
              }
              peVar1 = (in_RSI->template_str).
                       super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr;
              p_Var6 = (in_RSI->template_str).
                       super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
                }
              }
              pcVar2 = (in_RSI->it)._M_current;
              pcVar3 = (in_RSI->start)._M_current;
              p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x48);
              this = (Parser *)local_38._M_current;
              p_Var7->_M_use_count = 1;
              p_Var7->_M_weak_count = 1;
              p_Var7->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00291b10;
              p_Var7[1]._vptr__Sp_counted_base = (_func_int **)&PTR___cxa_pure_virtual_002919f0;
              *(element_type **)&p_Var7[1]._M_use_count = peVar1;
              p_Var7[2]._vptr__Sp_counted_base = (_func_int **)p_Var6;
              if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
                }
              }
              *(long *)&p_Var7[2]._M_use_count = (long)pcVar2 - (long)pcVar3;
              p_Var7[1]._vptr__Sp_counted_base = (_func_int **)&PTR_do_evaluate_00291b60;
              p_Var7[3]._vptr__Sp_counted_base =
                   (_func_int **)
                   local_68.
                   super__Vector_base<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              *(pointer *)&p_Var7[3]._M_use_count =
                   local_68.
                   super__Vector_base<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              p_Var7[4]._vptr__Sp_counted_base =
                   (_func_int **)
                   local_68.
                   super__Vector_base<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_68.
              super__Vector_base<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_68.
              super__Vector_base<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_68.
              super__Vector_base<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)local_38._M_current = p_Var7 + 1;
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_38._M_current + 8))->_M_pi =
                   p_Var7;
              if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
              }
              _Var8._M_pi = local_48.
                            super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi;
              if (local_48.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
              goto LAB_0020c131;
              goto LAB_0020c12c;
            }
            parseExpression((Parser *)local_88,SUB81(in_RSI,0));
            if ((pointer)local_88._0_8_ == (pointer)0x0) {
              prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar5,"Expected expression in array");
              __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            std::
            vector<std::shared_ptr<minja::Expression>,std::allocator<std::shared_ptr<minja::Expression>>>
            ::emplace_back<std::shared_ptr<minja::Expression>>
                      ((vector<std::shared_ptr<minja::Expression>,std::allocator<std::shared_ptr<minja::Expression>>>
                        *)&local_68,(shared_ptr<minja::Expression> *)local_88);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
            }
          } while ((in_RSI->it)._M_current != (in_RSI->end)._M_current);
        }
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,"Expected closing bracket");
      }
LAB_0020beed:
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    peVar1 = (in_RSI->template_str).
             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    _Var8._M_pi = (in_RSI->template_str).
                  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
    if (_Var8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (_Var8._M_pi)->_M_use_count = (_Var8._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (_Var8._M_pi)->_M_use_count = (_Var8._M_pi)->_M_use_count + 1;
      }
    }
    pcVar2 = (in_RSI->it)._M_current;
    pcVar3 = (in_RSI->start)._M_current;
    p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x48);
    p_Var6->_M_use_count = 1;
    p_Var6->_M_weak_count = 1;
    p_Var6->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00291b10;
    p_Var6[1]._vptr__Sp_counted_base = (_func_int **)&PTR___cxa_pure_virtual_002919f0;
    *(element_type **)&p_Var6[1]._M_use_count = peVar1;
    p_Var6[2]._vptr__Sp_counted_base = (_func_int **)_Var8._M_pi;
    if (_Var8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (_Var8._M_pi)->_M_use_count = (_Var8._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (_Var8._M_pi)->_M_use_count = (_Var8._M_pi)->_M_use_count + 1;
      }
    }
    *(long *)&p_Var6[2]._M_use_count = (long)pcVar2 - (long)pcVar3;
    p_Var6[1]._vptr__Sp_counted_base = (_func_int **)&PTR_do_evaluate_00291b60;
    p_Var6[3]._vptr__Sp_counted_base =
         (_func_int **)
         local_68.
         super__Vector_base<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)&p_Var6[3]._M_use_count =
         local_68.
         super__Vector_base<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    p_Var6[4]._vptr__Sp_counted_base =
         (_func_int **)
         local_68.
         super__Vector_base<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_68.
    super__Vector_base<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.
    super__Vector_base<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.
    super__Vector_base<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this->template_str).
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)(p_Var6 + 1);
    (this->template_str).
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = p_Var6;
    if (_Var8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_0020c12c:
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var8._M_pi);
    }
LAB_0020c131:
    std::
    vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
    ::~vector(&local_68);
    _Var8._M_pi = extraout_RDX_02;
  }
  sVar9.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var8._M_pi;
  sVar9.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<minja::Expression>)
         sVar9.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Expression> parseArray() {
        if (consumeToken("[").empty()) return nullptr;

        std::vector<std::shared_ptr<Expression>> elements;
        if (!consumeToken("]").empty()) {
            return std::make_shared<ArrayExpr>(get_location(), std::move(elements));
        }
        auto first_expr = parseExpression();
        if (!first_expr) throw std::runtime_error("Expected first expression in array");
        elements.push_back(std::move(first_expr));

        while (it != end) {
            if (!consumeToken(",").empty()) {
              auto expr = parseExpression();
              if (!expr) throw std::runtime_error("Expected expression in array");
              elements.push_back(std::move(expr));
            } else if (!consumeToken("]").empty()) {
                return std::make_shared<ArrayExpr>(get_location(), std::move(elements));
            } else {
                throw std::runtime_error("Expected comma or closing bracket in array");
            }
        }
        throw std::runtime_error("Expected closing bracket");
    }